

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Traversal.cpp
# Opt level: O3

FilterAction __thiscall MyFilter::acceptNode(MyFilter *this,DOMNode *node)

{
  int iVar1;
  FilterAction FVar2;
  
  FVar2 = FILTER_ACCEPT;
  if (this->fNodeType != 0) {
    iVar1 = (**(code **)(*(long *)node + 0x20))(node);
    if (iVar1 != this->fNodeType) {
      FVar2 = this->fReject ^ FILTER_SKIP;
    }
  }
  return FVar2;
}

Assistant:

DOMNodeFilter::FilterAction  MyFilter::acceptNode(const DOMNode* node) const {
    if (fNodeType == 0)
        return  DOMNodeFilter::FILTER_ACCEPT;
	if (node->getNodeType() ==  fNodeType) {
       	return  DOMNodeFilter::FILTER_ACCEPT;
	} else {
	    return  fReject ? DOMNodeFilter::FILTER_REJECT : DOMNodeFilter::FILTER_SKIP;
	}
}